

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

uint __thiscall capnp::compiler::NodeTranslator::StructLayout::Top::addData(Top *this,uint lgSize)

{
  uint uVar1;
  NullableValue<unsigned_int> *other;
  uint *puVar2;
  uint offset;
  uint *hole;
  undefined1 local_2c [8];
  NullableValue<unsigned_int> local_24;
  NullableValue<unsigned_int> _hole202;
  uint lgSize_local;
  Top *this_local;
  
  _hole202._0_4_ = lgSize;
  unique0x10000135 = this;
  HoleSet<unsigned_int>::tryAllocate((HoleSet<unsigned_int> *)local_2c,(int)this + 0x10);
  other = kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)local_2c);
  kj::_::NullableValue<unsigned_int>::NullableValue
            ((NullableValue<unsigned_int> *)(local_2c + 8),other);
  kj::Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)local_2c);
  puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)(local_2c + 8));
  if (puVar2 == (uint *)0x0) {
    uVar1 = this->dataWordCount;
    this->dataWordCount = uVar1 + 1;
    this_local._4_4_ = uVar1 << (6U - _hole202.isSet & 0x1f);
    HoleSet<unsigned_int>::addHolesAtEnd(&this->holes,_hole202._0_4_,this_local._4_4_ + 1,6);
  }
  else {
    puVar2 = kj::_::NullableValue<unsigned_int>::operator*
                       ((NullableValue<unsigned_int> *)(local_2c + 8));
    this_local._4_4_ = *puVar2;
  }
  kj::_::NullableValue<unsigned_int>::~NullableValue((NullableValue<unsigned_int> *)(local_2c + 8));
  return this_local._4_4_;
}

Assistant:

uint addData(uint lgSize) override {
      KJ_IF_SOME(hole, holes.tryAllocate(lgSize)) {
        return hole;
      } else {
        uint offset = dataWordCount++ << (6 - lgSize);
        holes.addHolesAtEnd(lgSize, offset + 1);
        return offset;
      }